

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem.cpp
# Opt level: O2

void __thiscall cxx::TypeGrammar::TypeGrammar(TypeGrammar *this)

{
  karma_rule<ast::Type_()> *this_00;
  string *this_01;
  karma_rule<ast::IntegerInterval_()> *this_02;
  adder *paVar1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[13]>_>_>,_0L>
  that;
  string local_110;
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f0;
  karma_symbols<ast::BuiltinType> *local_e8;
  string *local_e0;
  BuiltinType local_d4 [13];
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  undefined1 *local_58;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  
  std::__cxx11::string::string((string *)&local_110,"unnamed-grammar",(allocator *)&local_f0);
  this_00 = &this->type_;
  (this->super_karma_grammar<ast::Type_()>).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::karma::reference<const_boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::karma::grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->super_karma_grammar<ast::Type_()>).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  local_e0 = this_01;
  std::__cxx11::string::string((string *)&local_110,"unnamed-rule",(allocator *)&local_f0);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_110,"unnamed-rule",(allocator *)&local_f0);
  this_02 = &this->integer_interval_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_02,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_110,"symbols",(allocator *)&local_f0);
  boost::spirit::karma::
  symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::symbols(&this->builtin_type_,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  local_110._M_string_length = (size_type)&boost::spirit::standard::string;
  local_110._M_dataplus._M_p = (pointer)&local_f0;
  local_f0 = this_02;
  local_e8 = &this->builtin_type_;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,boost::variant<fidler::ast::BuiltinType,fidler::ast::IntegerInterval,std::__cxx11::string>(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::IntegerInterval(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::karma::symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::standard>>const&>,2l>>
            (this_00,&local_110);
  local_f0 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&stack0xffffffffffffffc0;
  local_40 = "std::int32_t";
  local_e8 = (karma_symbols<ast::BuiltinType> *)&local_50;
  local_50 = "";
  local_48 = &boost::spirit::int_;
  local_110._M_string_length = (size_type)&local_60;
  local_60 = "";
  local_58 = &boost::spirit::int_;
  local_110._M_dataplus._M_p = (pointer)&local_f0;
  boost::spirit::karma::
  rule<std::ostream_iterator<char,char,std::char_traits<char>>,fidler::ast::IntegerInterval(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[13]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::omit>,0l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::omit>,0l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&>,2l>>
            (this_02);
  local_d4[0xc] = 1;
  local_110._M_dataplus._M_p = "std::int8_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(&(this->builtin_type_).add,local_d4 + 0xc,(char **)&local_110);
  local_d4[0xb] = 2;
  local_f0 = (rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)0x61b999;
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 0xb,(char **)&local_f0);
  local_d4[10] = 3;
  local_40 = "std::int16_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 10,&stack0xffffffffffffffc0);
  local_d4[9] = 4;
  local_50 = "std::uint16_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 9,&local_50);
  local_d4[8] = 5;
  local_60 = "std::int32_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 8,&local_60);
  local_d4[7] = 6;
  local_68 = "std::uint32_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 7,&local_68);
  local_d4[6] = 7;
  local_70 = "std::int64_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 6,&local_70);
  local_d4[5] = 8;
  local_78 = "std::uint64_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 5,&local_78);
  local_d4[4] = 9;
  local_80 = "bool";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 4,&local_80);
  local_d4[3] = 10;
  local_88 = "std::string";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 3,&local_88);
  local_d4[2] = 0xb;
  local_90 = "float";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 2,&local_90);
  local_d4[1] = 0xc;
  local_98 = "double";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,local_d4 + 1,&local_98);
  local_d4[0] = ByteBuffer;
  local_a0 = "std::vector<std::uint8_t>";
  boost::spirit::karma::
  symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::adder::operator()(paVar1,local_d4,&local_a0);
  return;
}

Assistant:

TypeGrammar::TypeGrammar() :
		TypeGrammar::base_type(type_)
{
	namespace karma = boost::spirit::karma;

	type_
		%= integer_interval_
		| builtin_type_
		| karma::string
		;

	integer_interval_
		%= karma::lit("std::int32_t")
		<< karma::omit[karma::int_]
		<< karma::omit[karma::int_]
		;

	builtin_type_.add
		(ast::BuiltinType::Int8,       "std::int8_t")
		(ast::BuiltinType::UInt8,      "std::uint8_t")
		(ast::BuiltinType::Int16,      "std::int16_t")
		(ast::BuiltinType::UInt16,     "std::uint16_t")
		(ast::BuiltinType::Int32,      "std::int32_t")
		(ast::BuiltinType::UInt32,     "std::uint32_t")
		(ast::BuiltinType::Int64,      "std::int64_t")
		(ast::BuiltinType::UInt64,     "std::uint64_t")
		(ast::BuiltinType::Boolean,    "bool")
		(ast::BuiltinType::String,     "std::string")
		(ast::BuiltinType::Float,      "float")
		(ast::BuiltinType::Double,     "double")
		(ast::BuiltinType::ByteBuffer, "std::vector<std::uint8_t>")
		;
}